

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O0

ScalarFunction * duckdb::ListValueFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  init_local_state_t unaff_retaddr;
  LogicalType *in_stack_00000008;
  FunctionStability in_stack_00000010;
  FunctionNullHandling in_stack_00000018;
  bind_lambda_function_t in_stack_00000020;
  ScalarFunction *fun;
  LogicalType *other;
  code *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffee8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffef0;
  LogicalTypeId in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff04;
  bind_scalar_function_t in_stack_ffffffffffffffb8;
  scalar_function_t *in_stack_ffffffffffffffc0;
  LogicalType *in_stack_ffffffffffffffc8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  ScalarFunction *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  ScalarFunction *statistics;
  
  uVar2 = 0;
  statistics = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"list_value",(allocator *)&stack0xffffffffffffffcf);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x201f6d5);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffeff);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffeff);
  this = ListValueStats;
  uVar1 = 0;
  other = (LogicalType *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (bind_scalar_function_extended_t)CONCAT17(uVar2,in_stack_fffffffffffffff0),
             (function_statistics_t)statistics,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020);
  LogicalType::~LogicalType((LogicalType *)0x201f784);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x201f791);
  LogicalType::~LogicalType((LogicalType *)0x201f79e);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x201f7ab);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,uVar1),in_stack_fffffffffffffeff);
  LogicalType::operator=((LogicalType *)this,other);
  LogicalType::~LogicalType((LogicalType *)0x201f7f3);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction ListValueFun::GetFunction() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun("list_value", {}, LogicalTypeId::LIST, ListValueFunction, ListValueBind, nullptr,
	                   ListValueStats);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}